

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# That.hpp
# Opt level: O3

void ut11::Assert::That<char[16],ut11::Operands::IsStringEndingWith>
               (size_t line,string *file,char (*expected) [16],IsStringEndingWith *operand)

{
  pointer pcVar1;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  string local_b8;
  size_t local_98;
  undefined1 *local_90;
  ulong local_88;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  local_90 = local_80;
  sVar3 = strlen(*expected);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,expected,*expected + sVar3);
  local_98 = line;
  if (local_88 < (operand->m_expected)._M_string_length) {
    bVar4 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_90);
    if (local_b8._M_string_length == (operand->m_expected)._M_string_length) {
      if (local_b8._M_string_length == 0) {
        bVar4 = true;
      }
      else {
        iVar2 = bcmp(local_b8._M_dataplus._M_p,(operand->m_expected)._M_dataplus._M_p,
                     local_b8._M_string_length);
        bVar4 = iVar2 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (!bVar4) {
    pcVar1 = (file->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + file->_M_string_length);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    sVar3 = strlen(*expected);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,expected,*expected + sVar3);
    Operands::IsStringEndingWith::GetErrorMessage(&local_50,operand,&local_b8);
    Fail(local_98,&local_70,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

inline void That(std::size_t line, std::string file, const Expected& expected, const Operand& operand)
		{
			if ( operand(expected) )
				return;
			Fail(line, file, operand.GetErrorMessage(expected));
		}